

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSkinnedMesh.cpp
# Opt level: O2

void __thiscall irr::scene::CSkinnedMesh::resetAnimation(CSkinnedMesh *this)

{
  ushort uVar1;
  undefined4 uVar2;
  pointer ppSVar3;
  SJoint *pSVar4;
  long lVar5;
  SSkinMeshBuffer *pSVar6;
  long lVar7;
  undefined8 *puVar8;
  ulong uVar9;
  long lVar10;
  u32 j;
  ulong uVar11;
  
  for (uVar9 = 0;
      ppSVar3 = (this->AllJoints).m_data.
                super__Vector_base<irr::scene::ISkinnedMesh::SJoint_*,_std::allocator<irr::scene::ISkinnedMesh::SJoint_*>_>
                ._M_impl.super__Vector_impl_data._M_start,
      uVar9 < ((ulong)((long)(this->AllJoints).m_data.
                             super__Vector_base<irr::scene::ISkinnedMesh::SJoint_*,_std::allocator<irr::scene::ISkinnedMesh::SJoint_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar3) >> 3 &
              0xffffffff); uVar9 = uVar9 + 1) {
    pSVar4 = ppSVar3[uVar9];
    lVar10 = 0;
    uVar11 = 0;
    while( true ) {
      lVar5 = *(long *)&(pSVar4->Weights).m_data.
                        super__Vector_base<irr::scene::ISkinnedMesh::SWeight,_std::allocator<irr::scene::ISkinnedMesh::SWeight>_>
      ;
      lVar7 = (long)*(pointer *)((long)&(pSVar4->Weights).m_data + 8) - lVar5;
      if ((lVar7 / 0x30 & 0xffffffffU) <= uVar11) break;
      uVar1 = *(ushort *)(lVar5 + lVar10);
      uVar2 = *(undefined4 *)(lVar5 + 4 + lVar10);
      pSVar6 = (this->LocalBuffers).m_data.
               super__Vector_base<irr::scene::SSkinMeshBuffer_*,_std::allocator<irr::scene::SSkinMeshBuffer_*>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar1];
      puVar8 = (undefined8 *)
               (**(code **)((long)(pSVar6->super_IMeshBuffer)._vptr_IMeshBuffer + 0x108))
                         (pSVar6,uVar2,lVar7 % 0x30);
      *puVar8 = *(undefined8 *)(lVar5 + 0x18 + lVar10);
      *(undefined4 *)(puVar8 + 1) = *(undefined4 *)(lVar5 + 0x20 + lVar10);
      lVar5 = *(long *)&(pSVar4->Weights).m_data.
                        super__Vector_base<irr::scene::ISkinnedMesh::SWeight,_std::allocator<irr::scene::ISkinnedMesh::SWeight>_>
      ;
      pSVar6 = (this->LocalBuffers).m_data.
               super__Vector_base<irr::scene::SSkinMeshBuffer_*,_std::allocator<irr::scene::SSkinMeshBuffer_*>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar1];
      lVar7 = (**(code **)((long)(pSVar6->super_IMeshBuffer)._vptr_IMeshBuffer + 0x108))
                        (pSVar6,uVar2);
      *(undefined8 *)(lVar7 + 0xc) = *(undefined8 *)(lVar5 + 0x24 + lVar10);
      *(undefined4 *)(lVar7 + 0x14) = *(undefined4 *)(lVar5 + 0x2c + lVar10);
      uVar11 = uVar11 + 1;
      lVar10 = lVar10 + 0x30;
    }
  }
  this->SkinnedLastFrame = false;
  this->LastAnimatedFrame = -1.0;
  return;
}

Assistant:

void CSkinnedMesh::resetAnimation()
{
	// copy from the cache to the mesh...
	for (u32 i = 0; i < AllJoints.size(); ++i) {
		SJoint *joint = AllJoints[i];
		for (u32 j = 0; j < joint->Weights.size(); ++j) {
			const u16 buffer_id = joint->Weights[j].buffer_id;
			const u32 vertex_id = joint->Weights[j].vertex_id;
			LocalBuffers[buffer_id]->getVertex(vertex_id)->Pos = joint->Weights[j].StaticPos;
			LocalBuffers[buffer_id]->getVertex(vertex_id)->Normal = joint->Weights[j].StaticNormal;
		}
	}
	SkinnedLastFrame = false;
	LastAnimatedFrame = -1;
}